

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void free_monchn(monst *mon)

{
  monst *pmVar1;
  
  while (mon != (monst *)0x0) {
    pmVar1 = mon->nmon;
    if (mon->minvent != (obj *)0x0) {
      free_objchn(mon->minvent);
    }
    free(mon);
    mon = pmVar1;
  }
  return;
}

Assistant:

static void free_monchn(struct monst *mon)
{
	struct monst *mtmp2;

	while (mon) {
	    mtmp2 = mon->nmon;
	    
	    if (mon->minvent)
		free_objchn(mon->minvent);
	    dealloc_monst(mon);
	    mon = mtmp2;
	}
}